

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetworkClassifier *nn)

{
  Rep *pRVar1;
  long lVar2;
  bool bVar3;
  __type _Var4;
  Type *pTVar5;
  Type *b;
  Type *pTVar6;
  undefined1 *puVar7;
  RepeatedPtrField<CoreML::Specification::LossLayer> *this;
  byte bVar8;
  void **ppvVar9;
  int index;
  undefined1 *b_00;
  char *pcVar10;
  byte bVar11;
  ulong uVar12;
  int j;
  int iVar13;
  long lVar14;
  string err;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string target;
  string targetTypeString;
  string typeString;
  string trainingInputTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  iVar13 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar13 < 2) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
    goto LAB_0027e75d;
  }
  trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index = 0;
  while( true ) {
    target._M_dataplus._M_p._0_4_ = index;
    if (iVar13 <= index) break;
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,index);
    iVar13 = 0;
    do {
      if ((modelDescription->input_).super_RepeatedPtrFieldBase.current_size_ <= iVar13) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&trainingInputExclusiveIndices,(value_type_conflict5 *)&target);
        break;
      }
      b = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                    (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar13);
      bVar3 = CoreML::Specification::isEquivalent(pTVar5,b);
      iVar13 = iVar13 + 1;
    } while (!bVar3);
    index = (int)target._M_dataplus._M_p + 1;
    iVar13 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  }
  if ((long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
  else if ((long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start >> 2 == (long)iVar13) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
  else {
    target._M_dataplus._M_p = (pointer)&target.field_2;
    target._M_string_length = 0;
    target.field_2._M_local_buf[0] = '\0';
    puVar7 = (undefined1 *)nn->updateparams_;
    if ((NetworkUpdateParameters *)puVar7 == (NetworkUpdateParameters *)0x0) {
      puVar7 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    this = &((NetworkUpdateParameters *)puVar7)->losslayers_;
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,0);
    if (pTVar6->_oneof_case_[0] == 10) {
      google::protobuf::internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,0);
LAB_0027e403:
      std::__cxx11::string::_M_assign((string *)&target);
    }
    else {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,0);
      if (pTVar6->_oneof_case_[0] == 0xb) {
        google::protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                  (&this->super_RepeatedPtrFieldBase,0);
        goto LAB_0027e403;
      }
    }
    bVar11 = 0;
    uVar12 = 0;
    do {
      if ((ulong)((long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar12) {
        if (bVar11 == 0) {
          std::operator+(&trainingInputTarget,
                         "The training inputs don\'t include the target of the classifier: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(modelDescription->predictedfeaturename_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe));
          std::__cxx11::string::operator=((string *)&err,(string *)&trainingInputTarget);
          std::__cxx11::string::~string((string *)&trainingInputTarget);
          CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        }
        else {
          CoreML::Result::Result(__return_storage_ptr__);
        }
        break;
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,
                          trainingInputExclusiveIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12]);
      std::__cxx11::string::string
                ((string *)&trainingInputTarget,
                 (string *)((ulong)(pTVar5->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      _Var4 = std::operator==(&trainingInputTarget,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(modelDescription->predictedfeaturename_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe));
      bVar8 = bVar11;
      if (_Var4) {
        pRVar1 = (modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar9 = pRVar1->elements;
        if (pRVar1 == (Rep *)0x0) {
          ppvVar9 = (void **)0x0;
        }
        iVar13 = (modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
        lVar14 = 0;
        do {
          if ((long)iVar13 * 8 == lVar14) goto LAB_0027e6b4;
          lVar2 = *(long *)((long)ppvVar9 + lVar14);
          _Var4 = std::operator==(&trainingInputTarget,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*(ulong *)(lVar2 + 0x10) & 0xfffffffffffffffe));
          lVar14 = lVar14 + 8;
        } while (!_Var4);
        puVar7 = (undefined1 *)pTVar5->type_;
        if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
          puVar7 = CoreML::Specification::_FeatureType_default_instance_;
        }
        b_00 = *(undefined1 **)(lVar2 + 0x20);
        if ((FeatureType *)b_00 == (FeatureType *)0x0) {
          b_00 = CoreML::Specification::_FeatureType_default_instance_;
        }
        bVar3 = CoreML::Specification::operator==((FeatureType *)puVar7,(FeatureType *)b_00);
        bVar8 = 1;
        if (bVar3) goto LAB_0027e6b4;
        puVar7 = *(undefined1 **)(lVar2 + 0x20);
        if (puVar7 == (undefined1 *)0x0) {
          puVar7 = CoreML::Specification::_FeatureType_default_instance_;
        }
        pcVar10 = "String";
        if (*(int *)(puVar7 + 0x24) == 1) {
          pcVar10 = "Int64";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&typeString,pcVar10,(allocator<char> *)&targetTypeString);
        puVar7 = (undefined1 *)pTVar5->type_;
        if ((FeatureType *)puVar7 == (FeatureType *)0x0) {
          puVar7 = CoreML::Specification::_FeatureType_default_instance_;
        }
        pcVar10 = "String";
        if (((FeatureType *)puVar7)->_oneof_case_[0] == 1) {
          pcVar10 = "Int64";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targetTypeString,pcVar10,(allocator<char> *)&local_50);
        std::operator+(&local_118,"The type of the training input provided: ",&trainingInputTarget);
        std::operator+(&local_f8,&local_118,
                       " doesn\'t match the expected type of the classifier. Found: ");
        std::operator+(&local_90,&local_f8,&targetTypeString);
        std::operator+(&local_d8,&local_90,", expected: ");
        std::operator+(&local_70,&local_d8,&typeString);
        std::operator+(&local_50,&local_70,".");
        std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        std::__cxx11::string::~string((string *)&targetTypeString);
        std::__cxx11::string::~string((string *)&typeString);
        bVar3 = false;
      }
      else {
LAB_0027e6b4:
        _Var4 = std::operator==(&target,&trainingInputTarget);
        bVar11 = _Var4 | bVar8;
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)&trainingInputTarget);
      uVar12 = uVar12 + 1;
    } while (bVar3);
    std::__cxx11::string::~string((string *)&target);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&trainingInputExclusiveIndices.super__Vector_base<int,_std::allocator<int>_>);
LAB_0027e75d:
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}